

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O1

void * SimulatorThread(void *pParam)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  FILE *pFVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  CHRONO chrono;
  char logsimufilename [256];
  double local_348;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  interval local_2f0;
  double local_2d8;
  ulong uStack_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  interval local_2b0;
  interval local_298;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  timeval local_258;
  timespec local_240;
  double local_230;
  double dStack_228;
  double local_220;
  double dStack_218;
  timespec local_210;
  int local_200;
  double local_1f8;
  FILE *local_1f0;
  double local_1e8;
  vector<double,_std::allocator<double>_> local_1e0;
  vector<double,_std::allocator<double>_> local_1c8;
  vector<double,_std::allocator<double>_> local_1b0;
  vector<double,_std::allocator<double>_> local_198;
  vector<double,_std::allocator<double>_> local_180;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_150;
  char local_138 [264];
  
  if (bDisablelogsimu == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar11 = strtimeex_fns();
    sprintf(local_138,"log/logsimu_%.64s.csv",pcVar11);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    pFVar12 = fopen(local_138,"w");
    if (pFVar12 == (FILE *)0x0) {
      puts("Unable to create log file.");
      goto LAB_00191fe9;
    }
    fwrite("t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;EPU1;EPU2;\n"
           ,0x260,1,pFVar12);
    fflush(pFVar12);
  }
  else {
    pFVar12 = (FILE *)0x0;
  }
  GNSSqualitySimulator = 0;
  x_sim = x_0;
  y_sim = y_0;
  z_sim = z_0;
  phi_sim = phi_0;
  theta_sim = theta_0;
  psi_sim = psi_0;
  vrx_sim = vrx_0;
  vry_sim = vry_0;
  vrz_sim = vrz_0;
  omegax_sim = omegax_0;
  omegay_sim = omegay_0;
  omegaz_sim = omegaz_0;
  alpha_mes_simulator = alpha_0;
  d_sim = d_0;
  iVar6 = clock_getres(4,&local_210);
  if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_240), iVar6 == 0)) {
    local_200 = 0;
    local_230 = 0.0;
    dStack_228 = 0.0;
    local_220 = 0.0;
    dStack_218 = 0.0;
  }
  dVar20 = local_220;
  dVar17 = dStack_218;
  if (local_200 == 0) {
    iVar6 = clock_gettime(4,(timespec *)&local_2f0);
    local_348 = 0.0;
    if (iVar6 == 0) {
      dVar20 = (double)(((long)local_2f0.inf + (long)local_220 +
                        ((long)local_2f0.sup + (long)dStack_218) / 1000000000) - local_240.tv_sec);
      dVar17 = (double)(((long)local_2f0.sup + (long)dStack_218) % 1000000000 - local_240.tv_nsec);
      if ((long)dVar17 < 0) {
        dVar20 = (double)((long)dVar20 + (long)dVar17 / 1000000000 + -1);
        dVar17 = (double)((long)dVar17 % 1000000000 + 1000000000);
      }
      goto LAB_0018d6d5;
    }
  }
  else {
LAB_0018d6d5:
    local_348 = (double)(long)dVar17 / 1000000000.0 + (double)(long)dVar20;
  }
  local_270 = 0.0;
  local_1f0 = pFVar12;
  do {
    local_2f0.inf = (double)(((long)simulatorperiod * 1000) / 1000000);
    local_2f0.sup = (double)((((long)simulatorperiod * 1000) % 1000000) * 1000);
    nanosleep((timespec *)&local_2f0,(timespec *)0x0);
    dVar20 = local_220;
    dVar17 = dStack_218;
    if (local_200 == 0) {
      iVar6 = clock_gettime(4,(timespec *)&local_2f0);
      local_260 = local_348;
      if (iVar6 == 0) {
        local_2f0.inf =
             (double)(((long)local_2f0.inf + (long)local_220 +
                      ((long)local_2f0.sup + (long)dStack_218) / 1000000000) - local_240.tv_sec);
        local_2f0.sup =
             (double)(((long)local_2f0.sup + (long)dStack_218) % 1000000000 - local_240.tv_nsec);
        dVar20 = local_2f0.inf;
        dVar17 = local_2f0.sup;
        if ((long)local_2f0.sup < 0) {
          local_2f0.inf = (double)((long)local_2f0.inf + (long)local_2f0.sup / 1000000000 + -1);
          local_2f0.sup = (double)((long)local_2f0.sup % 1000000000 + 1000000000);
          dVar20 = local_2f0.inf;
          dVar17 = local_2f0.sup;
        }
        goto LAB_0018d7b5;
      }
    }
    else {
LAB_0018d7b5:
      local_260 = (double)(long)dVar17 / 1000000000.0 + (double)(long)dVar20;
    }
    iVar6 = gettimeofday(&local_258,(__timezone_ptr_t)0x0);
    if (iVar6 != 0) {
      local_258.tv_sec = 0;
      local_258.tv_usec = 0;
    }
    local_1e8 = (double)local_258.tv_sec;
    local_348 = local_260 - local_348;
    local_268 = (double)local_258.tv_usec * 1e-06;
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    dVar19 = vtwind_var;
    local_300 = vtwind_med;
    iVar6 = rand();
    dVar18 = psitwind_var;
    local_2f8 = psitwind_med;
    iVar7 = rand();
    dVar16 = vc_var;
    dVar15 = vc_med;
    iVar8 = rand();
    dVar22 = psic_var;
    local_2d8 = psic_med;
    iVar9 = rand();
    dVar21 = hw_var;
    iVar10 = rand();
    dVar17 = vry_sim;
    dVar20 = vrx_sim;
    if (robid < 0x10000) {
      dVar15 = dVar16 * (((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0) + dVar15;
      dVar17 = dVar22 * (((double)iVar9 + (double)iVar9) / 2147483647.0 + -1.0) + local_2d8;
      dVar21 = dVar21 * (((double)iVar10 + (double)iVar10) / 2147483647.0 + -1.0);
      if (robid == 1) {
        dVar19 = cos(psi_sim);
        dVar18 = cos(dVar17);
        dVar19 = dVar19 * dVar20 + dVar18 * dVar15;
        local_2d8 = vrx_sim;
        dVar20 = sin(psi_sim);
        dVar17 = sin(dVar17);
        dVar22 = phi_sim;
        dVar16 = phi_bias_err;
        dVar18 = phi_max_rand_err;
        dVar17 = dVar20 * local_2d8 + dVar17 * dVar15;
        x_sim = local_348 * dVar19 + x_sim;
        y_sim = local_348 * dVar17 + y_sim;
        dVar20 = (u3 * alphaz + vzup) * local_348 + z_sim;
        z_sim = 0.0;
        if (dVar20 <= 0.0) {
          z_sim = dVar20;
        }
        psi_sim = (u1 - u2) * alphaomegaz * local_348 + psi_sim;
        vrx_sim = ((u1 + u2) * alphavrx - alphafvrx * vrx_sim) * local_348 + vrx_sim;
        iVar6 = rand();
        local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar18 + dVar16 +
                    dVar22;
        interval::interval(&local_298,&local_308);
        local_310 = -phi_ahrs_acc;
        interval::interval(&local_2b0,&local_310,&phi_ahrs_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&phi_ahrs,&local_2f0);
        dVar15 = theta_sim;
        dVar18 = theta_bias_err;
        dVar20 = theta_max_rand_err;
        iVar6 = rand();
        local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar20 + dVar18 +
                    dVar15;
        interval::interval(&local_298,&local_308);
        local_310 = -theta_ahrs_acc;
        interval::interval(&local_2b0,&local_310,&theta_ahrs_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&theta_ahrs,&local_2f0);
        dVar15 = psi_sim;
        dVar18 = psi_bias_err;
        dVar20 = psi_max_rand_err;
        iVar6 = rand();
        local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar20 + dVar18 +
                    dVar15;
        interval::interval(&local_298,&local_308);
        local_310 = -psi_ahrs_acc;
        interval::interval(&local_2b0,&local_310,&psi_ahrs_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&psi_ahrs,&local_2f0);
        dVar18 = z_max_rand_err;
        dVar20 = z_sim + z_bias_err;
        iVar6 = rand();
        local_308 = dVar21 + (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar18 +
                             dVar20;
        interval::interval(&local_298,&local_308);
        local_310 = -z_pressure_acc;
        interval::interval(&local_2b0,&local_310,&z_pressure_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&z_pressure,&local_2f0);
        if ((bEnableSimulatedGNSS == 0) ||
           (((bNoSimGNSSInsideObstacles != 0 &&
             (dVar20 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar20)) ||
            (dVar20 = x_sim, dVar18 = x_bias_err, dVar21 = x_max_rand_err,
            z_sim < GPS_submarine_depth_limit)))) {
          GNSSqualitySimulator = 0;
        }
        else {
          GNSSqualitySimulator = 1;
          iVar6 = rand();
          dVar22 = y_sim;
          dVar16 = y_bias_err;
          dVar15 = y_max_rand_err;
          dVar20 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar21 + dVar18 +
                   dVar20;
          iVar6 = rand();
          local_2f8 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar15 + dVar16 +
                      dVar22;
          local_2d8 = x_max_rand_err * 5.0;
          iVar6 = rand();
          dVar16 = alt_env;
          dVar15 = lat_env;
          dVar18 = angle_env;
          local_300 = long_env;
          local_2c0 = cos(angle_env);
          local_2c8 = sin(dVar18);
          dVar21 = sin(dVar18);
          dVar18 = cos(dVar18);
          dVar15 = ((dVar21 * dVar20 + dVar18 * local_2f8) / 6371000.0) * 57.29577951308232 + dVar15
          ;
          dVar21 = 0.0;
          if ((2.220446049250313e-16 <= ABS(dVar15 + -90.0)) &&
             (dVar21 = 0.0, 2.220446049250313e-16 <= ABS(dVar15 + 90.0))) {
            dVar18 = local_2f8 * local_2c8;
            dVar20 = dVar20 * local_2c0;
            dVar21 = cos(dVar15 * 0.017453292519943295);
            dVar21 = local_300 + (((dVar20 - dVar18) / 6371000.0) * 57.29577951308232) / dVar21;
          }
          ComputeGNSSPosition(dVar15,dVar21,
                              dVar16 + local_2d8 *
                                       (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) + 0.0
                              ,GNSSqualitySimulator,0,0.0);
          dVar20 = dVar17 * dVar17 + dVar19 * dVar19;
          if (dVar20 < 0.0) {
            sog = sqrt(dVar20);
          }
          else {
            sog = SQRT(dVar20);
          }
          local_308 = atan2(dVar17,dVar19);
          interval::interval(&local_298,&local_308);
          local_310 = -3.141592653589793;
          local_2b8 = 3.141592653589793;
          interval::interval(&local_2b0,&local_310,&local_2b8);
          operator+(&local_298,&local_2b0);
          interval::operator=((interval *)&cog_gps,&local_2f0);
        }
        dVar20 = vrx_sim;
        dVar21 = vrx_bias_err;
        dVar17 = vrx_max_rand_err;
        if (bEnableSimulatedDVL == 0) {
          local_298.inf = -10000.0;
          local_2b0.inf = 10000.0;
          interval::interval(&local_2f0,&local_298.inf,&local_2b0.inf);
          interval::operator=((interval *)&vrx_dvl,&local_2f0);
          local_298.inf = -10000.0;
          local_2b0.inf = 10000.0;
          interval::interval(&local_2f0,&local_298.inf,&local_2b0.inf);
          interval::operator=((interval *)&vry_dvl,&local_2f0);
          local_298.inf = -10000.0;
          local_2b0.inf = 10000.0;
        }
        else {
          iVar6 = rand();
          dVar19 = vry_sim;
          dVar15 = vry_bias_err;
          dVar18 = vry_max_rand_err;
          dVar20 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar17 + dVar21 +
                   dVar20;
          iVar6 = rand();
          dVar17 = vrz_sim;
          dVar16 = vrz_bias_err;
          dVar21 = vrz_max_rand_err;
          dVar19 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar18 + dVar15 +
                   dVar19;
          iVar6 = rand();
          dVar17 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar21 + dVar16 +
                   dVar17;
          local_298.inf = dVar20 - dvl_acc;
          local_2b0.inf = dVar20 + dvl_acc;
          interval::interval(&local_2f0,&local_298.inf,&local_2b0.inf);
          interval::operator=((interval *)&vrx_dvl,&local_2f0);
          local_298.inf = dVar19 - dvl_acc;
          local_2b0.inf = dVar19 + dvl_acc;
          interval::interval(&local_2f0,&local_298.inf,&local_2b0.inf);
          interval::operator=((interval *)&vry_dvl,&local_2f0);
          local_298.inf = dVar17 - dvl_acc;
          local_2b0.inf = dVar17 + dvl_acc;
        }
        interval::interval(&local_2f0,&local_298.inf,&local_2b0.inf);
        interval::operator=((interval *)&vrz_dvl,&local_2f0);
      }
      else if (robid == 0x100) {
        dVar21 = cos(psi_sim);
        dVar19 = cos(alphaomegaz * uw);
        dVar18 = cos(dVar17);
        dVar16 = vrx_sim;
        dVar19 = dVar19 * dVar21 * dVar20 + dVar18 * dVar15;
        dVar20 = sin(psi_sim);
        dVar21 = cos(alphaomegaz * uw);
        dVar17 = sin(dVar17);
        dVar22 = vrx_sim;
        dVar17 = dVar21 * dVar20 * dVar16 + dVar17 * dVar15;
        dVar20 = sin(alphaomegaz * uw);
        dVar15 = phi_sim;
        dVar18 = phi_bias_err;
        dVar21 = phi_max_rand_err;
        x_sim = local_348 * dVar19 + x_sim;
        y_sim = local_348 * dVar17 + y_sim;
        psi_sim = ((dVar20 * dVar22) / alphaz) * local_348 + psi_sim;
        vrx_sim = (u * alphavrx - alphafvrx * vrx_sim) * local_348 + vrx_sim;
        vry_sim = vry_sim * -0.1 * local_348 + vry_sim;
        iVar6 = rand();
        local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar21 + dVar18 +
                    dVar15;
        interval::interval(&local_298,&local_308);
        local_310 = -phi_ahrs_acc;
        interval::interval(&local_2b0,&local_310,&phi_ahrs_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&phi_ahrs,&local_2f0);
        dVar18 = theta_sim;
        dVar21 = theta_bias_err;
        dVar20 = theta_max_rand_err;
        iVar6 = rand();
        local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar20 + dVar21 +
                    dVar18;
        interval::interval(&local_298,&local_308);
        local_310 = -theta_ahrs_acc;
        interval::interval(&local_2b0,&local_310,&theta_ahrs_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&theta_ahrs,&local_2f0);
        dVar18 = psi_sim;
        dVar21 = psi_bias_err;
        dVar20 = psi_max_rand_err;
        iVar6 = rand();
        local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar20 + dVar21 +
                    dVar18;
        interval::interval(&local_298,&local_308);
        local_310 = -psi_ahrs_acc;
        interval::interval(&local_2b0,&local_310,&psi_ahrs_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&psi_ahrs,&local_2f0);
        if ((bEnableSimulatedGNSS != 0) &&
           ((bNoSimGNSSInsideObstacles == 0 ||
            (dVar20 = CheckInsideObstacle(x_sim,y_sim,false), dVar20 < 0.0)))) {
          dVar18 = x_sim;
          dVar21 = x_bias_err;
          dVar20 = x_max_rand_err;
          GNSSqualitySimulator = 1;
          iVar6 = rand();
          dVar22 = y_sim;
          dVar16 = y_bias_err;
          dVar15 = y_max_rand_err;
          dVar18 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar20 + dVar21 +
                   dVar18;
          iVar6 = rand();
          local_2f8 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar15 + dVar16 +
                      dVar22;
          local_2d8 = x_max_rand_err * 5.0;
          iVar6 = rand();
          dVar16 = alt_env;
          dVar15 = lat_env;
          dVar21 = angle_env;
          local_300 = long_env;
          local_2c0 = cos(angle_env);
          local_2c8 = sin(dVar21);
          dVar20 = sin(dVar21);
          dVar21 = cos(dVar21);
          dVar15 = ((dVar20 * dVar18 + dVar21 * local_2f8) / 6371000.0) * 57.29577951308232 + dVar15
          ;
          dVar20 = 0.0;
          if ((2.220446049250313e-16 <= ABS(dVar15 + -90.0)) &&
             (dVar20 = 0.0, 2.220446049250313e-16 <= ABS(dVar15 + 90.0))) {
            dVar21 = local_2f8 * local_2c8;
            dVar18 = dVar18 * local_2c0;
            dVar20 = cos(dVar15 * 0.017453292519943295);
            dVar20 = local_300 + (((dVar18 - dVar21) / 6371000.0) * 57.29577951308232) / dVar20;
          }
          ComputeGNSSPosition(dVar15,dVar20,
                              dVar16 + local_2d8 *
                                       (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) + 0.0
                              ,GNSSqualitySimulator,0,0.0);
          dVar20 = dVar17 * dVar17 + dVar19 * dVar19;
          if (dVar20 < 0.0) {
            sog = sqrt(dVar20);
          }
          else {
            sog = SQRT(dVar20);
          }
          local_308 = atan2(dVar17,dVar19);
          interval::interval(&local_298,&local_308);
          local_310 = -3.141592653589793;
          local_2b8 = 3.141592653589793;
          interval::interval(&local_2b0,&local_310,&local_2b8);
          goto LAB_00190f29;
        }
LAB_0019081e:
        GNSSqualitySimulator = 0;
      }
      else if (robid == 0x1000) {
        dVar16 = dVar19 * (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) + local_300;
        dVar18 = dVar18 * (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) + local_2f8;
        local_2f8 = alphaomegaz * uw;
        local_2d8 = u * 0.8999999999999999 + 0.3;
        uStack_2d0 = 0;
        dVar20 = cos(psi_sim - dVar18);
        dVar19 = cos(local_2d8);
        if (0.0 <= dVar19 + dVar20) {
          dVar20 = sin(psi_sim - dVar18);
          if (dVar20 <= 0.0) {
            local_2d8 = -local_2d8;
            uStack_2d0 = uStack_2d0 ^ 0x8000000000000000;
          }
        }
        else {
          local_2d8 = (3.141592653589793 - psi_sim) + dVar18;
          uStack_2d0 = 0;
        }
        dVar20 = alphaz * vrx_sim;
        local_2c0 = sin(local_2f8);
        local_2c0 = local_2c0 * dVar20;
        dVar20 = alphavrx * dVar16;
        dVar19 = sin((psi_sim + local_2d8) - dVar18);
        dVar19 = dVar19 * dVar20;
        local_280 = vrx_sim;
        local_300 = cos(psi_sim);
        local_2c8 = dVar16 * 0.01;
        dVar20 = cos(dVar18);
        local_300 = local_300 * local_280 + dVar20 * local_2c8;
        dVar20 = cos(dVar17);
        local_280 = dVar20 * dVar15 + local_300;
        local_278 = vrx_sim;
        local_300 = sin(psi_sim);
        dVar20 = sin(dVar18);
        local_300 = local_300 * local_278 + dVar20 * local_2c8;
        dVar20 = sin(dVar17);
        dVar20 = dVar20 * dVar15 + local_300;
        dVar17 = sin(local_2d8);
        dVar15 = sin(local_2f8);
        x_sim = local_348 * local_280 + x_sim;
        y_sim = local_348 * dVar20 + y_sim;
        vrx_sim = ((dVar17 * dVar19 - dVar15 * local_2c0) - alphafvrx * vrx_sim * vrx_sim) *
                  0.0035714285714285713 * local_348 + vrx_sim;
        psi_sim = omegaz_sim * local_348 + psi_sim;
        dVar17 = cos(local_2d8);
        dVar15 = cos(local_2f8);
        omegaz_sim = (dVar21 * 100.0 +
                     (((dVar17 * -0.5 + 0.5) * dVar19 + dVar15 * -1.5 * local_2c0) -
                     alphafomegaz * omegaz_sim)) * 0.02 * local_348 + omegaz_sim;
        dVar22 = local_270 * -40.0;
        dVar17 = cos(local_2d8);
        dVar21 = cos(phi_sim);
        dVar15 = sin(phi_sim);
        dVar2 = phi_bias_err;
        dVar1 = phi_max_rand_err;
        local_270 = local_270 +
                    ((dVar15 * -549.36) / 15.0 +
                    (dVar21 * dVar17 * dVar19 * 2.1) / 15.0 + dVar22 / 15.0) * local_348;
        dVar17 = local_348 * local_270 + phi_sim;
        phi_sim = dVar17;
        iVar6 = rand();
        local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar1 + dVar2 + dVar17
        ;
        interval::interval(&local_298,&local_308);
        local_310 = -phi_ahrs_acc;
        interval::interval(&local_2b0,&local_310,&phi_ahrs_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&phi_ahrs,&local_2f0);
        dVar19 = theta_sim;
        dVar21 = theta_bias_err;
        dVar17 = theta_max_rand_err;
        iVar6 = rand();
        local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar17 + dVar21 +
                    dVar19;
        interval::interval(&local_298,&local_308);
        local_310 = -theta_ahrs_acc;
        interval::interval(&local_2b0,&local_310,&theta_ahrs_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&theta_ahrs,&local_2f0);
        dVar19 = psi_sim;
        dVar21 = psi_bias_err;
        dVar17 = psi_max_rand_err;
        iVar6 = rand();
        local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar17 + dVar21 +
                    dVar19;
        interval::interval(&local_298,&local_308);
        local_310 = -psi_ahrs_acc;
        interval::interval(&local_2b0,&local_310,&psi_ahrs_acc);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&psi_ahrs,&local_2f0);
        if ((bEnableSimulatedGNSS == 0) ||
           ((bNoSimGNSSInsideObstacles != 0 &&
            (dVar17 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar17)))) goto LAB_0019081e;
        dVar19 = x_sim;
        dVar21 = x_bias_err;
        dVar17 = x_max_rand_err;
        GNSSqualitySimulator = 1;
        iVar6 = rand();
        dVar1 = y_sim;
        dVar22 = y_bias_err;
        dVar15 = y_max_rand_err;
        dVar19 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar17 + dVar21 + dVar19;
        iVar6 = rand();
        local_2c0 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar15 + dVar22 +
                    dVar1;
        local_2f8 = x_max_rand_err * 5.0;
        iVar6 = rand();
        dVar15 = alt_env;
        dVar21 = angle_env;
        local_300 = lat_env;
        local_2c8 = long_env;
        local_278 = cos(angle_env);
        local_1f8 = sin(dVar21);
        dVar17 = sin(dVar21);
        dVar21 = cos(dVar21);
        dVar21 = ((dVar17 * dVar19 + dVar21 * local_2c0) / 6371000.0) * 57.29577951308232 +
                 local_300;
        dVar17 = 0.0;
        if ((2.220446049250313e-16 <= ABS(dVar21 + -90.0)) &&
           (dVar17 = 0.0, 2.220446049250313e-16 <= ABS(dVar21 + 90.0))) {
          dVar22 = local_2c0 * local_1f8;
          dVar19 = dVar19 * local_278;
          dVar17 = cos(dVar21 * 0.017453292519943295);
          dVar17 = local_2c8 + (((dVar19 - dVar22) / 6371000.0) * 57.29577951308232) / dVar17;
        }
        ComputeGNSSPosition(dVar21,dVar17,
                            dVar15 + local_2f8 *
                                     (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) + 0.0,
                            GNSSqualitySimulator,0,0.0);
        uVar13 = SUB84(local_280,0);
        uVar14 = (undefined4)((ulong)local_280 >> 0x20);
        dVar17 = dVar20 * dVar20 + local_280 * local_280;
        if (dVar17 < 0.0) {
          sog = sqrt(dVar17);
          uVar13 = SUB84(local_280,0);
          uVar14 = (undefined4)((ulong)local_280 >> 0x20);
        }
        else {
          sog = SQRT(dVar17);
        }
        local_308 = atan2(dVar20,(double)CONCAT44(uVar14,uVar13));
        interval::interval(&local_298,&local_308);
        local_310 = -3.141592653589793;
        local_2b8 = 3.141592653589793;
        interval::interval(&local_2b0,&local_310,&local_2b8);
        operator+(&local_298,&local_2b0);
        interval::operator=((interval *)&cog_gps,&local_2f0);
        dVar20 = fmod((((-angle_env - (local_2d8 + psi_sim)) + 1.5707963267948966) * 180.0) /
                      3.141592653589793,360.0);
        sailangle = fmod(dVar20 + 360.0,360.0);
        dVar20 = psitwind_var;
        iVar6 = rand();
        dVar17 = psitwind_var;
        psitwind = dVar18 + (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar20 + 0.0;
        iVar6 = rand();
        vtwind = dVar16 + (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar17 + 0.0;
      }
    }
    else if (robid == 0x10000) {
      dVar17 = alphavrx * u;
      vrx_sim = dVar17;
      dVar20 = cos(psi_sim);
      dVar18 = vrx_sim;
      dVar20 = dVar20 * dVar17;
      dVar17 = sin(psi_sim);
      dVar19 = psi_bias_err;
      dVar21 = psi_max_rand_err;
      dVar17 = dVar17 * dVar18;
      x_sim = local_348 * dVar20 + x_sim;
      y_sim = local_348 * dVar17 + y_sim;
      dVar18 = uw * alphaomegaz * local_348 + psi_sim;
      psi_sim = dVar18;
      iVar6 = rand();
      local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar21 + dVar19 + dVar18
      ;
      interval::interval(&local_298,&local_308);
      local_310 = -psi_ahrs_acc;
      interval::interval(&local_2b0,&local_310,&psi_ahrs_acc);
      operator+(&local_298,&local_2b0);
      interval::operator=((interval *)&psi_ahrs,&local_2f0);
      if ((bEnableSimulatedGNSS == 0) ||
         ((bNoSimGNSSInsideObstacles != 0 &&
          (dVar21 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar21)))) goto LAB_0019081e;
      dVar18 = x_sim;
      dVar19 = x_bias_err;
      dVar21 = x_max_rand_err;
      GNSSqualitySimulator = 1;
      iVar6 = rand();
      dVar22 = y_sim;
      dVar16 = y_bias_err;
      dVar15 = y_max_rand_err;
      dVar18 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar21 + dVar19 + dVar18;
      iVar6 = rand();
      local_2f8 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar15 + dVar16 + dVar22
      ;
      local_2d8 = x_max_rand_err * 5.0;
      iVar6 = rand();
      dVar16 = alt_env;
      dVar15 = lat_env;
      dVar19 = angle_env;
      local_300 = long_env;
      local_2c0 = cos(angle_env);
      local_2c8 = sin(dVar19);
      dVar21 = sin(dVar19);
      dVar19 = cos(dVar19);
      dVar15 = ((dVar21 * dVar18 + dVar19 * local_2f8) / 6371000.0) * 57.29577951308232 + dVar15;
      dVar21 = 0.0;
      if ((2.220446049250313e-16 <= ABS(dVar15 + -90.0)) &&
         (dVar21 = 0.0, 2.220446049250313e-16 <= ABS(dVar15 + 90.0))) {
        dVar19 = local_2f8 * local_2c8;
        dVar18 = dVar18 * local_2c0;
        dVar21 = cos(dVar15 * 0.017453292519943295);
        dVar21 = local_300 + (((dVar18 - dVar19) / 6371000.0) * 57.29577951308232) / dVar21;
      }
      ComputeGNSSPosition(dVar15,dVar21,
                          dVar16 + local_2d8 *
                                   (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) + 0.0,
                          GNSSqualitySimulator,0,0.0);
      dVar21 = dVar17 * dVar17 + dVar20 * dVar20;
      if (dVar21 < 0.0) {
        sog = sqrt(dVar21);
      }
      else {
        sog = SQRT(dVar21);
      }
LAB_00190eb1:
      local_308 = atan2(dVar17,dVar20);
      interval::interval(&local_298,&local_308);
      local_310 = -3.141592653589793;
      local_2b8 = 3.141592653589793;
      interval::interval(&local_2b0,&local_310,&local_2b8);
LAB_00190f29:
      operator+(&local_298,&local_2b0);
      interval::operator=((interval *)&cog_gps,&local_2f0);
    }
    else if (robid == 0x100000) {
      dVar17 = alphavrx * u;
      vrx_sim = dVar17;
      dVar21 = cos(psi_sim);
      dVar20 = cos(alphaomegaz * uw);
      dVar19 = vrx_sim;
      dVar20 = dVar20 * dVar21 * dVar17;
      dVar21 = sin(psi_sim);
      dVar17 = cos(alphaomegaz * uw);
      dVar15 = vrx_sim;
      dVar17 = dVar17 * dVar21 * dVar19;
      dVar21 = sin(alphaomegaz * uw);
      dVar18 = psi_bias_err;
      dVar19 = psi_max_rand_err;
      x_sim = local_348 * dVar20 + x_sim;
      y_sim = local_348 * dVar17 + y_sim;
      dVar21 = ((dVar21 * dVar15) / alphaz) * local_348 + psi_sim;
      psi_sim = dVar21;
      iVar6 = rand();
      local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar19 + dVar18 + dVar21
      ;
      interval::interval(&local_298,&local_308);
      local_310 = -psi_ahrs_acc;
      interval::interval(&local_2b0,&local_310,&psi_ahrs_acc);
      operator+(&local_298,&local_2b0);
      interval::operator=((interval *)&psi_ahrs,&local_2f0);
      if ((bEnableSimulatedGNSS != 0) &&
         ((bNoSimGNSSInsideObstacles == 0 ||
          (dVar21 = CheckInsideObstacle(x_sim,y_sim,false), dVar21 < 0.0)))) {
        dVar18 = x_sim;
        dVar19 = x_bias_err;
        dVar21 = x_max_rand_err;
        GNSSqualitySimulator = 1;
        iVar6 = rand();
        dVar22 = y_sim;
        dVar16 = y_bias_err;
        dVar15 = y_max_rand_err;
        dVar18 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar21 + dVar19 + dVar18;
        iVar6 = rand();
        local_2f8 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar15 + dVar16 +
                    dVar22;
        local_2d8 = x_max_rand_err * 5.0;
        iVar6 = rand();
        dVar16 = alt_env;
        dVar15 = lat_env;
        dVar19 = angle_env;
        local_300 = long_env;
        local_2c0 = cos(angle_env);
        local_2c8 = sin(dVar19);
        dVar21 = sin(dVar19);
        dVar19 = cos(dVar19);
        dVar15 = ((dVar21 * dVar18 + dVar19 * local_2f8) / 6371000.0) * 57.29577951308232 + dVar15;
        dVar21 = 0.0;
        if ((2.220446049250313e-16 <= ABS(dVar15 + -90.0)) &&
           (dVar21 = 0.0, 2.220446049250313e-16 <= ABS(dVar15 + 90.0))) {
          dVar19 = local_2f8 * local_2c8;
          dVar18 = dVar18 * local_2c0;
          dVar21 = cos(dVar15 * 0.017453292519943295);
          dVar21 = local_300 + (((dVar18 - dVar19) / 6371000.0) * 57.29577951308232) / dVar21;
        }
        ComputeGNSSPosition(dVar15,dVar21,
                            dVar16 + local_2d8 *
                                     (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) + 0.0,
                            GNSSqualitySimulator,0,0.0);
        dVar21 = dVar17 * dVar17 + dVar20 * dVar20;
        if (dVar21 < 0.0) {
          sog = sqrt(dVar21);
        }
        else {
LAB_0018fc95:
          sog = SQRT(dVar21);
        }
        goto LAB_00190eb1;
      }
      GNSSqualitySimulator = 0;
    }
    else if (robid == 0x1000000) {
      dVar21 = u3 * alphaz;
      dVar19 = alphaomegaz * uw;
      local_2d8 = alphavrx * u;
      dVar18 = cos(psi_sim);
      dVar2 = ul * alphavrx;
      dVar15 = sin(psi_sim);
      dVar18 = dVar18 * local_2d8;
      dVar16 = alphafvrx * vrx_sim;
      local_2d8 = alphavrx * u;
      dVar22 = sin(psi_sim);
      local_2f8 = alphavrx * ul;
      dVar1 = cos(psi_sim);
      dVar5 = phi_sim;
      dVar4 = phi_bias_err;
      dVar3 = phi_max_rand_err;
      x_sim = local_348 * dVar20 + x_sim;
      y_sim = local_348 * dVar17 + y_sim;
      z_sim = dVar21 * local_348 + z_sim;
      psi_sim = dVar19 * local_348 + psi_sim;
      vrx_sim = ((dVar18 - dVar15 * dVar2) - dVar16) * local_348 + vrx_sim;
      vry_sim = (vry_sim * -0.1 + dVar22 * local_2d8 + dVar1 * local_2f8) * local_348 + vry_sim;
      iVar6 = rand();
      local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar3 + dVar4 + dVar5;
      interval::interval(&local_298,&local_308);
      local_310 = -phi_ahrs_acc;
      interval::interval(&local_2b0,&local_310,&phi_ahrs_acc);
      operator+(&local_298,&local_2b0);
      interval::operator=((interval *)&phi_ahrs,&local_2f0);
      dVar18 = theta_sim;
      dVar19 = theta_bias_err;
      dVar21 = theta_max_rand_err;
      iVar6 = rand();
      local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar21 + dVar19 + dVar18
      ;
      interval::interval(&local_298,&local_308);
      local_310 = -theta_ahrs_acc;
      interval::interval(&local_2b0,&local_310,&theta_ahrs_acc);
      operator+(&local_298,&local_2b0);
      interval::operator=((interval *)&theta_ahrs,&local_2f0);
      dVar18 = psi_sim;
      dVar19 = psi_bias_err;
      dVar21 = psi_max_rand_err;
      iVar6 = rand();
      local_308 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar21 + dVar19 + dVar18
      ;
      interval::interval(&local_298,&local_308);
      local_310 = -psi_ahrs_acc;
      interval::interval(&local_2b0,&local_310,&psi_ahrs_acc);
      operator+(&local_298,&local_2b0);
      interval::operator=((interval *)&psi_ahrs,&local_2f0);
      if ((bEnableSimulatedGNSS != 0) &&
         ((bNoSimGNSSInsideObstacles == 0 ||
          (dVar21 = CheckInsideObstacle(x_sim,y_sim,false), dVar21 < 0.0)))) {
        dVar18 = x_sim;
        dVar19 = x_bias_err;
        dVar21 = x_max_rand_err;
        GNSSqualitySimulator = 1;
        iVar6 = rand();
        dVar22 = y_sim;
        dVar16 = y_bias_err;
        dVar15 = y_max_rand_err;
        dVar18 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar21 + dVar19 + dVar18;
        iVar6 = rand();
        local_2f8 = (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar15 + dVar16 +
                    dVar22;
        local_2d8 = x_max_rand_err * 5.0;
        iVar6 = rand();
        dVar16 = alt_env;
        dVar15 = lat_env;
        dVar19 = angle_env;
        local_300 = long_env;
        local_2c0 = cos(angle_env);
        local_2c8 = sin(dVar19);
        dVar21 = sin(dVar19);
        dVar19 = cos(dVar19);
        dVar15 = ((dVar21 * dVar18 + dVar19 * local_2f8) / 6371000.0) * 57.29577951308232 + dVar15;
        dVar21 = 0.0;
        if ((2.220446049250313e-16 <= ABS(dVar15 + -90.0)) &&
           (dVar21 = 0.0, 2.220446049250313e-16 <= ABS(dVar15 + 90.0))) {
          dVar19 = local_2f8 * local_2c8;
          dVar18 = dVar18 * local_2c0;
          dVar21 = cos(dVar15 * 0.017453292519943295);
          dVar21 = local_300 + (((dVar18 - dVar19) / 6371000.0) * 57.29577951308232) / dVar21;
        }
        ComputeGNSSPosition(dVar15,dVar21,
                            dVar16 + local_2d8 *
                                     (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) + 0.0,
                            GNSSqualitySimulator,0,0.0);
        dVar21 = dVar17 * dVar17 + dVar20 * dVar20;
        if (0.0 <= dVar21) goto LAB_0018fc95;
        sog = sqrt(dVar21);
        goto LAB_00190eb1;
      }
      GNSSqualitySimulator = 0;
    }
    dVar17 = alpha_bias_err;
    dVar20 = alpha_max_rand_err;
    alpha_mes_simulator = ((double)simulatorperiod / 1000.0) * omegas + alpha_mes_simulator;
    if (alpha_0 + 6.283185307179586 < alpha_mes_simulator) {
      alpha_mes_simulator = alpha_0;
    }
    dVar18 = alpha_mes_simulator;
    iVar6 = rand();
    dVar19 = y_sim;
    dVar21 = x_sim;
    alpha_sim = dVar18 - ((((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar20 + dVar17)
    ;
    dVar20 = alpha_sim + alphas + psi_sim;
    std::vector<double,_std::allocator<double>_>::vector(&local_198,&walls_xa);
    std::vector<double,_std::allocator<double>_>::vector(&local_1b0,&walls_ya);
    std::vector<double,_std::allocator<double>_>::vector(&local_1c8,&walls_xb);
    std::vector<double,_std::allocator<double>_>::vector(&local_150,&walls_yb);
    dVar20 = DistanceDirSegments(dVar21,dVar19,dVar20,&local_198,&local_1b0,&local_1c8,&local_150);
    if (local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    dVar19 = y_sim;
    dVar21 = x_sim;
    dVar17 = alpha_sim + alphas + psi_sim;
    std::vector<double,_std::allocator<double>_>::vector(&local_168,&circles_x);
    std::vector<double,_std::allocator<double>_>::vector(&local_1e0,&circles_y);
    std::vector<double,_std::allocator<double>_>::vector(&local_180,&circles_r);
    dVar17 = DistanceDirCircles(dVar21,dVar19,dVar17,&local_168,&local_1e0,&local_180);
    if (local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar13 = SUB84(dVar17,0);
    uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
    if (dVar20 <= dVar17) {
      uVar13 = SUB84(dVar20,0);
      uVar14 = (undefined4)((ulong)dVar20 >> 0x20);
    }
    d_sim = (double)CONCAT44(uVar14,uVar13);
    iVar6 = rand();
    if ((double)iVar6 / 2147483647.0 < outliers_ratio) {
      dVar20 = (double)rangescale;
      iVar6 = rand();
      d_sim = ((double)iVar6 * dVar20) / 2147483647.0;
    }
    dVar21 = d_sim;
    dVar17 = d_bias_err;
    dVar20 = d_max_rand_err;
    iVar6 = rand();
    d_mes_simulator =
         (((double)iVar6 + (double)iVar6) / 2147483647.0 + -1.0) * dVar20 + dVar17 + dVar21;
    if (d_mes_simulator <= 0.0) {
      d_mes_simulator = 0.0;
    }
    if (d_all_mes_simulator.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        d_all_mes_simulator.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
        super__Vector_impl_data._M_start) {
      d_all_mes_simulator.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
      super__Vector_impl_data._M_finish =
           d_all_mes_simulator.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    interval::interval(&local_2f0,&d_mes_simulator);
    std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
              (&d_all_mes_simulator,(vector<interval,_std::allocator<interval>_> *)&local_2f0);
    if (alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                ((deque<double,std::allocator<double>> *)&alpha_mes_simulator_vector,
                 &alpha_mes_simulator);
    }
    else {
      *alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = alpha_mes_simulator;
      alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 1;
    }
    if (d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                ((deque<double,std::allocator<double>> *)&d_mes_simulator_vector,&d_mes_simulator);
    }
    else {
      *d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = d_mes_simulator;
      d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 1;
    }
    std::
    deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
    ::push_back(&d_all_mes_simulator_vector,&d_all_mes_simulator);
    local_2f0.inf = (double)local_258.tv_usec * 1e-06 + (double)local_258.tv_sec;
    std::deque<double,_std::allocator<double>_>::emplace_back<double>
              (&t_simulator_history_vector,&local_2f0.inf);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&xhat_simulator_history_vector,(value_type *)&xhat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&yhat_simulator_history_vector,(value_type *)&yhat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&psihat_simulator_history_vector,(value_type *)&psihat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&vrxhat_simulator_history_vector,(value_type *)&vrxhat);
    if (6.283185307179586 / (((double)simulatorperiod / 1000.0) * omegas) <
        (double)(int)((int)((ulong)((long)alpha_mes_simulator_vector.
                                          super__Deque_base<double,_std::allocator<double>_>._M_impl
                                          .super__Deque_impl_data._M_start._M_last -
                                   (long)alpha_mes_simulator_vector.
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_start._M_cur) >> 3) +
                      (int)((ulong)((long)alpha_mes_simulator_vector.
                                          super__Deque_base<double,_std::allocator<double>_>._M_impl
                                          .super__Deque_impl_data._M_finish._M_cur -
                                   (long)alpha_mes_simulator_vector.
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_finish._M_first) >> 3) +
                     ((((uint)((int)alpha_mes_simulator_vector.
                                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                    super__Deque_impl_data._M_finish._M_node -
                              (int)alpha_mes_simulator_vector.
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (uint)(alpha_mes_simulator_vector.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x40))
    {
      std::deque<double,_std::allocator<double>_>::pop_front(&alpha_mes_simulator_vector);
      std::deque<double,_std::allocator<double>_>::pop_front(&d_mes_simulator_vector);
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::pop_front(&d_all_mes_simulator_vector);
      std::deque<double,_std::allocator<double>_>::pop_front(&t_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&xhat_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&yhat_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&psihat_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&vrxhat_simulator_history_vector);
    }
    dVar16 = y_sim;
    dVar15 = x_sim;
    dVar21 = alt_env;
    dVar18 = long_env;
    dVar19 = lat_env;
    dVar17 = angle_env;
    local_2d8 = z_sim;
    local_2f8 = cos(angle_env);
    local_300 = sin(dVar17);
    dVar20 = sin(dVar17);
    dVar17 = cos(dVar17);
    dVar19 = ((dVar20 * dVar15 + dVar17 * dVar16) / 6371000.0) * 57.29577951308232 + dVar19;
    dVar20 = 0.0;
    if ((2.220446049250313e-16 <= ABS(dVar19 + -90.0)) &&
       (2.220446049250313e-16 <= ABS(dVar19 + 90.0))) {
      dVar16 = dVar16 * local_300;
      dVar15 = dVar15 * local_2f8;
      dVar20 = cos(dVar19 * 0.017453292519943295);
      dVar20 = dVar18 + (((dVar15 - dVar16) / 6371000.0) * 57.29577951308232) / dVar20;
    }
    dVar17 = fmod((-angle_env - psi_sim) + 4.71238898038469,6.283185307179586);
    dVar17 = fmod(dVar17 + 9.42477796076938,6.283185307179586);
    pFVar12 = local_1f0;
    if (local_1f0 != (FILE *)0x0) {
      local_268 = local_268 + local_1e8;
      dVar21 = dVar21 + local_2d8;
      dVar18 = fmod((alpha_sim * 180.0) / 3.141592653589793,360.0);
      fmod(dVar18 + 540.0,360.0);
      fprintf(pFVar12,
              "%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;\n"
              ,SUB84(local_268,0),SUB84(dVar19,0),dVar20,dVar21,
              ((dVar17 + -3.141592653589793 + 3.141592653589793) * 180.0) / 3.141592653589793,0,0,0)
      ;
      fflush(pFVar12);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    local_348 = local_260;
  } while (bExit == 0);
  if ((local_200 == 0) && (iVar6 = clock_gettime(4,(timespec *)&local_2f0), iVar6 == 0)) {
    local_230 = local_2f0.inf;
    dStack_228 = local_2f0.sup;
    local_2f0.inf =
         (double)(((long)local_2f0.inf + (long)local_220 +
                  ((long)local_2f0.sup + (long)dStack_218) / 1000000000) - local_240.tv_sec);
    local_2f0.sup =
         (double)(((long)local_2f0.sup + (long)dStack_218) % 1000000000 - local_240.tv_nsec);
    if ((long)local_2f0.sup < 0) {
      local_2f0.inf = (double)((long)local_2f0.inf + (long)local_2f0.sup / 1000000000 + -1);
      local_2f0.sup = (double)((long)local_2f0.sup % 1000000000 + 1000000000);
    }
    local_220 = local_2f0.inf;
    dStack_218 = local_2f0.sup;
  }
  GNSSqualitySimulator = 0;
  if (pFVar12 != (FILE *)0x0) {
    fclose(pFVar12);
  }
LAB_00191fe9:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SimulatorThread(void* pParam)
{
	CHRONO chrono;
	double dt = 0, t = 0, t0 = 0, t_epoch = 0;
	struct timeval tv;

	// Wind, current and waves.
	double psitwind_sim = 0, vtwind_sim = 0;
	double vc = 0, psic = 0, hw = 0;
	
	// Motorboat simulator...
	double alphafvry = 0.1;

	// Sailboat simulator...
	double deltas = 0, phidot = 0;

	// Simulated sonar...
	double d1 = 0, d2 = 0;
	double t_last_stepangles = 0;
	// Temporary...
	double stepangles = (simulatorperiod/1000.0)*omegas;// 0.6;

	double lat = 0, lon = 0, alt = 0, hdg = 0;

	FILE* logsimufile = NULL;
	char logsimufilename[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	if (!bDisablelogsimu)
	{
		EnterCriticalSection(&strtimeCS);
		sprintf(logsimufilename, LOG_FOLDER"logsimu_%.64s.csv", strtimeex_fns());
		LeaveCriticalSection(&strtimeCS);
		logsimufile = fopen(logsimufilename, "w");
		if (logsimufile == NULL)
		{
			printf("Unable to create log file.\n");
			if (!bExit) bExit = TRUE; // Unexpected program exit...
			return 0;
		}

		fprintf(logsimufile,
			"t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);"
			"t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;"
			"xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;"
			"wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;"
			"uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;"
			"EPU1;EPU2;\n"
		);
		fflush(logsimufile);
	}

	GNSSqualitySimulator = GNSS_NO_FIX;

	t = 0;

	x_sim = x_0; y_sim = y_0; z_sim = z_0; phi_sim = phi_0; theta_sim = theta_0; psi_sim = psi_0; vrx_sim = vrx_0; vry_sim = vry_0; vrz_sim = vrz_0; omegax_sim = omegax_0; omegay_sim = omegay_0; omegaz_sim = omegaz_0;
	alpha_mes_simulator = alpha_0; d_sim = d_0;

	StartChrono(&chrono);
	GetTimeElapsedChrono(&chrono, &t);

	t_last_stepangles = t;

	for (;;)
	{
		uSleep(1000*simulatorperiod);
		t0 = t;
		GetTimeElapsedChrono(&chrono, &t);
		dt = t-t0;

		//printf("SimulatorThread period : %f s.\n", dt);

		if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
		t_epoch = tv.tv_sec+0.000001*tv.tv_usec;
		//utc = 1000.0*tv.tv_sec+0.001*tv.tv_usec;

		EnterCriticalSection(&StateVariablesCS);

		// Simulated environnement evolution (wind, current and waves).
		vtwind_sim = vtwind_med+vtwind_var*(2.0*rand()/(double)RAND_MAX-1.0);
		psitwind_sim = psitwind_med+psitwind_var*(2.0*rand()/(double)RAND_MAX-1.0);
		vc = vc_med+vc_var*(2.0*rand()/(double)RAND_MAX-1.0);
		psic = psic_med+psic_var*(2.0*rand()/(double)RAND_MAX-1.0);
		hw = hw_var*(2.0*rand()/(double)RAND_MAX-1.0);

		if (robid == SUBMARINE_SIMULATOR_ROBID)
		{
			// z_sim should change when at the surface because of waves, but not underwater...
			// z_mes should change underwater because of waves, but not at the surface...

			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim)+vc*cos(psic);
			double ydot = vrx_sim*sin(psi_sim)+vc*sin(psic);
			double zdot = u3*alphaz+vzup;
			double psidot = (u1-u2)*alphaomegaz;
			//double psidot = omegaz_sim;
			double vrxdot = (u1+u2)*alphavrx-vrx_sim*alphafvrx;
			//double omegazdot = (u1-u2)*alphaomegaz-omegaz_sim*alphafomegaz;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			z_sim = min(z_sim+dt*zdot, 0.0); // z always negative.
			psi_sim = psi_sim+dt*psidot;
			vrx_sim = vrx_sim+dt*vrxdot;
			//omegaz_sim = omegaz_sim+dt*omegazdot;

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// Pressure sensor.
			// Simplification : on suppose qu'il envoie directement z au lieu de pressure.
			// Les vagues perturbent ses mesures.
			z_pressure = z_sim+z_bias_err+z_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0)+hw+interval(-z_pressure_acc, z_pressure_acc); // Waves influence...
			// GPS available on surface.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0)))&&
				(z_sim >= GPS_submarine_depth_limit))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
			// DVL.
			if (bEnableSimulatedDVL)
			{
				double vrx_mes = vrx_sim+sensor_err(vrx_bias_err, vrx_max_rand_err);
				double vry_mes = vry_sim+sensor_err(vry_bias_err, vry_max_rand_err);
				double vrz_mes = vrz_sim+sensor_err(vrz_bias_err, vrz_max_rand_err);
				vrx_dvl = interval(vrx_mes-dvl_acc, vrx_mes+dvl_acc);
				vry_dvl = interval(vry_mes-dvl_acc, vry_mes+dvl_acc);
				vrz_dvl = interval(vrz_mes-dvl_acc, vrz_mes+dvl_acc);
			}
			else
			{
				vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
				vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
				vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
			}
		}
		else if (robid == MOTORBOAT_SIMULATOR_ROBID)
		{
			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim)*cos(alphaomegaz*uw)+vc*cos(psic);
			double ydot = vrx_sim*sin(psi_sim)*cos(alphaomegaz*uw)+vc*sin(psic);
			double psidot = vrx_sim*sin(alphaomegaz*uw)/alphaz;
			double vrxdot = u*alphavrx-vrx_sim*alphafvrx;
			double vrydot = -vry_sim*alphafvry;
			//double xdot = vx_sim;
			//double ydot = vy_sim;
			//double psidot = ;
			//double vrxdot = ;
			//double vrydot = ;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			psi_sim = psi_sim+dt*psidot;
			vrx_sim = vrx_sim+dt*vrxdot;
			vry_sim = vry_sim+dt*vrydot;
			//vx_sim = vx_sim+dt*vxdot;
			//vy_sim = vy_sim+dt*vydot;

			//delta = beta*u(2);
			//theta = x(3);
			//vx = x(4);
			//vy = x(5);
			//xdot = [vx;vy;
			//        (vx*cos(theta)+vy*sin(theta))*sin(delta)/(L/2);
			//        alpha*u(1)*cos(theta)-alphaf*vx;
			//        alpha*u(1)*sin(theta)-alphaf*vy];

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
		}
		else if (robid == SAILBOAT_SIMULATOR_ROBID)
		{
			// The model is described in "L. Jaulin Mod�lisation et commande d'un bateau � voile, CIFA2004, Douz (Tunisie)".

			double alphaomegax = 40.0;
			double m = 280.0;
			double Jx = 15.0;
			double Jz = 50.0;
			double l = 0.5;
			double h = 2.1;
			double rr = 1.5;
			double rs = 0.5;
			double leq = 0.2;
			double deltasminreal = 0.30;
			double deltasmaxreal = 1.20;
			double alphaw = 100.0;
			double beta = 0.01;

			double deltar = alphaomegaz*uw;
			double deltasmaxsimu = deltasminreal+u*(deltasmaxreal-deltasminreal);

			double gamma = cos(psi_sim-psitwind_sim)+cos(deltasmaxsimu);
			if (gamma<0) deltas = M_PI-psi_sim+psitwind_sim; // Voile en drapeau.
			else if (sin(psi_sim-psitwind_sim)>0) deltas = deltasmaxsimu; else deltas = -deltasmaxsimu;
			double fg = alphaz*vrx_sim*sin(deltar);
			double fv = alphavrx*vtwind_sim*sin(psi_sim+deltas-psitwind_sim);

			double xdot = vrx_sim*cos(psi_sim)+beta*vtwind_sim*cos(psitwind_sim)+vc*cos(psic);
			double ydot = vrx_sim*sin(psi_sim)+beta*vtwind_sim*sin(psitwind_sim)+vc*sin(psic);
			double vrxdot = (1/m)*(sin(deltas)*fv-sin(deltar)*fg-alphafvrx*vrx_sim*vrx_sim);
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			vrx_sim = vrx_sim+dt*vrxdot;
			psi_sim += omegaz_sim*dt;
			omegaz_sim += (1/Jz)*((l-rs*cos(deltas))*fv-rr*cos(deltar)*fg-alphafomegaz*omegaz_sim+alphaw*hw)*dt;
			phidot += (-alphaomegax*phidot/Jx+fv*h*cos(deltas)*cos(phi_sim)/Jx-m*9.81*leq*sin(phi_sim)/Jx)*dt;
			phi_sim += phidot*dt;

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
				sailangle = fmod_360_pos_rad2deg(-angle_env-(psi_sim+deltas)+M_PI/2.0); // Specific to VAIMOS...
				psitwind = psitwind_sim+sensor_err(0, psitwind_var);
				vtwind = vtwind_sim+sensor_err(0, psitwind_var);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
		}
		else if (robid == TANK_SIMULATOR_ROBID)
		{
			vrx_sim = alphavrx*u;

			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim);
			double ydot = vrx_sim*sin(psi_sim);
			double psidot = uw*alphaomegaz;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			psi_sim = psi_sim+dt*psidot;

			// Simulated sensors measurements.
			// Compass.
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
			// Odometers...
			//vrx_mes = vrx_sim+vrx_bias_err+vrx_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
		}
		else if (robid == BUGGY_SIMULATOR_ROBID)
		{
			vrx_sim = alphavrx*u;

			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim)*cos(alphaomegaz*uw);
			double ydot = vrx_sim*sin(psi_sim)*cos(alphaomegaz*uw);
			double psidot = vrx_sim*sin(alphaomegaz*uw)/alphaz;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			psi_sim = psi_sim+dt*psidot;

			// Simulated sensors measurements.
			// Compass.
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
			// Odometers...
			//vrx_mes = vrx_sim+vrx_bias_err+vrx_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
		}
		else if (robid == QUADRO_SIMULATOR_ROBID)
		{

			//double m = 10, b = 2, delt = 1, l = 1;

			//box sqrtuquadro = box(4);
			//sqrtuquadro[1] = sqrt(u1); sqrtuquadro[2] = sqrt(u2); sqrtuquadro[3] = sqrt(u3); sqrtuquadro[4] = sqrt(u4);
			//box w = 5*sqrtuquadro;

			//imatrix R_Euler = RotationPhiThetaPsi(phi_sim, theta_sim, psi_sim);
			//box Vr = box(vrx_sim, vry_sim, vrz_sim);
			//box pdot = R_Euler*Vr;
			//box p = box(x_sim, y_sim, z_sim);
			//p = p+dt*pdot;
			//x_sim = Center(p[1]);
			//y_sim = Center(p[2]);
			//z_sim = Center(p[3]);

			//rmatrix M = Zeros(3, 3);
			//M.SetVal(1, 1, 1); M.SetVal(1, 2, tan(theta_sim)*sin(phi_sim)); M.SetVal(1, 3, tan(theta_sim)*cos(phi_sim));
			//M.SetVal(2, 1, 0); M.SetVal(2, 2, cos(phi_sim)); M.SetVal(2, 3, -sin(phi_sim));
			//M.SetVal(3, 1, 0); M.SetVal(3, 2, sin(phi_sim)/cos(theta_sim)); M.SetVal(3, 3, cos(phi_sim)/cos(theta_sim));

			//box Wr = box(omegax_sim, omegay_sim, omegaz_sim);
			//box anglesdot = imatrix(M)*Wr;
			//box angles = box(phi_sim, theta_sim, psi_sim);
			//angles = angles+dt*anglesdot;
			//phi_sim = Center(angles[1]);
			//theta_sim = Center(angles[2]);
			//psi_sim = Center(angles[3]);
			//
			//rmatrix B = Zeros(4, 4);
			//B.SetVal(1, 1, b); B.SetVal(1, 2, b); B.SetVal(1, 3, b); B.SetVal(1, 4, b);
			//B.SetVal(2, 1, -b*l); B.SetVal(2, 2, 0); B.SetVal(2, 3, b*l); B.SetVal(2, 4, 0);
			//B.SetVal(3, 1, 0); B.SetVal(3, 2, -b*l); B.SetVal(3, 3, 0); B.SetVal(3, 4, b*l);
			//B.SetVal(4, 1, -delt); B.SetVal(4, 2, delt); B.SetVal(4, 3, -delt); B.SetVal(4, 4, delt);

			//box wabsw = box(4);
			//wabsw[1] = w[1]*Abs(w[1]); wabsw[2] = w[2]*Abs(w[2]); wabsw[3] = w[3]*Abs(w[3]); wabsw[4] = w[4]*Abs(w[4]);

			//box tau = imatrix(B)*wabsw;

			//box Vrdot = Transpose(R_Euler)*box(0, 0, STANDARD_GRAVITY)+box(0, 0, -tau[1]/m)-box(Wr[2]*Vr[3]-Wr[3]*Vr[2], Wr[3]*Vr[1]-Wr[1]*Vr[3], Wr[1]*Vr[2]-Wr[2]*Vr[1]);
			//Vr = Vr+dt*Vrdot;
			//vrx_sim = Center(Vr[1]);
			//vry_sim = Center(Vr[2]);
			//vrz_sim = Center(Vr[3]);

			//rmatrix I = Zeros(3, 3);
			//I.SetVal(1, 1, 10); I.SetVal(1, 2, 0); I.SetVal(1, 3, 0);
			//I.SetVal(2, 1, 0); I.SetVal(2, 2, 10); I.SetVal(2, 3, 0);
			//I.SetVal(3, 1, 0); I.SetVal(3, 2, 0); I.SetVal(3, 3, 20);

			//box IWr = imatrix(I)*Wr;
			//box Wrdot = imatrix(Inv(I))*(box(tau[2], tau[3], tau[4])-box(Wr[2]*IWr[3]-Wr[3]*IWr[2], Wr[3]*IWr[1]-Wr[1]*IWr[3], Wr[1]*IWr[2]-Wr[2]*IWr[1]));
			//Wr = Wr+dt*Wrdot;
			//omegax_sim = Center(Wr[1]);
			//omegay_sim = Center(Wr[2]);
			//omegaz_sim = Center(Wr[3]);

			// Not fully implemented...

			// Simulated state evolution.
			double xdot = vrx_sim;
			double ydot = vry_sim;
			double zdot = u3*alphaz;
			double psidot = alphaomegaz*uw;
			double vrxdot = alphavrx*u*cos(psi_sim)-alphavrx*ul*sin(psi_sim)-alphafvrx*vrx_sim;
			double vrydot = alphavrx*u*sin(psi_sim)+alphavrx*ul*cos(psi_sim)-alphafvry*vry_sim;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			z_sim = z_sim+dt*zdot;
			psi_sim = psi_sim+dt*psidot;
			vrx_sim = vrx_sim+dt*vrxdot;
			vry_sim = vry_sim+dt*vrydot;

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
		}

		// Sonar.
		//for (;;)
		{
		//if (t-t_last_stepangles <= stepangles/omegas) break;

		// nsteps == 2*M_PI/stepangles
		// Previously, stepangles == (simulatorperiod/1000.0)*omegas
		
		t_last_stepangles += stepangles/omegas;
		//alpha_mes_simulator = alpha_mes_simulator+stepangles;
		alpha_mes_simulator = alpha_mes_simulator+(simulatorperiod/1000.0)*omegas;
		if (alpha_mes_simulator > 2*M_PI+alpha_0)
		{
			alpha_mes_simulator = alpha_0;
		}
		alpha_sim = alpha_mes_simulator-sensor_err(alpha_bias_err, alpha_max_rand_err);
		// Compute the distance to the first obstacle d. d might be oo if no obstacle found.
		d1 = DistanceDirSegments(x_sim, y_sim, alpha_sim+alphas+psi_sim, walls_xa, walls_ya, walls_xb, walls_yb);
		d2 = DistanceDirCircles(x_sim, y_sim, alpha_sim+alphas+psi_sim, circles_x, circles_y, circles_r);
		d_sim = min(d1, d2);

		// Generate outliers.
		if ((double)rand()/(double)RAND_MAX < outliers_ratio)
		{
			d_sim = rangescale*(double)rand()/(double)RAND_MAX;
		}

		d_mes_simulator = d_sim+sensor_err(d_bias_err, d_max_rand_err);
		d_mes_simulator = max(0.0, d_mes_simulator);
		//d_mes_simulator = max(0.0, min((double)rangescale, d_mes_simulator));

		// For compatibility with a Seanet...
		d_all_mes_simulator.clear();
		/*
		// Outlier before the wall.
		d_all_mes_simulator.push_back(d_mes_simulator*(double)rand()/(double)RAND_MAX);
		*/
		// Wall (or sometimes also an outlier...).
		d_all_mes_simulator.push_back(d_mes_simulator);
		/*
		// Outlier after the wall.
		d_all_mes_simulator.push_back(d_mes_simulator+(rangescale-d_mes_simulator)*(double)rand()/(double)RAND_MAX);
		*/

		alpha_mes_simulator_vector.push_back(alpha_mes_simulator);
		d_mes_simulator_vector.push_back(d_mes_simulator);
		d_all_mes_simulator_vector.push_back(d_all_mes_simulator);
		t_simulator_history_vector.push_back(tv.tv_sec+0.000001*tv.tv_usec);
		xhat_simulator_history_vector.push_back(xhat);
		yhat_simulator_history_vector.push_back(yhat);
		psihat_simulator_history_vector.push_back(psihat);
		vrxhat_simulator_history_vector.push_back(vrxhat);

		if ((int)alpha_mes_simulator_vector.size() > 2*M_PI/((simulatorperiod/1000.0)*omegas))
		{
			alpha_mes_simulator_vector.pop_front();
			d_mes_simulator_vector.pop_front();
			d_all_mes_simulator_vector.pop_front();
			t_simulator_history_vector.pop_front();
			xhat_simulator_history_vector.pop_front();
			yhat_simulator_history_vector.pop_front();
			psihat_simulator_history_vector.pop_front();
			vrxhat_simulator_history_vector.pop_front();
		}
		}

		EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_sim, y_sim, z_sim, &lat, &lon, &alt);
		hdg = (fmod_2PI(-angle_env-psi_sim+3.0*M_PI/2.0)+M_PI)*180.0/M_PI;

		if (logsimufile)
		{
			fprintf(logsimufile,
				"%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;\n",
				t_epoch, lat, lon, alt, hdg, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, d_sim, fmod_360_rad2deg(alpha_sim), 0.0, utc,
				t, x_sim, y_sim, z_sim, 0.0, 0.0, psi_sim,
				vrx_sim, 0.0, 0.0, 0.0, 0.0, omegaz_sim, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0, u1, u2, u3, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0);
			fflush(logsimufile);
		}

		LeaveCriticalSection(&StateVariablesCS);

		if (bExit) break;
	}

	StopChrono(&chrono, &t);

	GNSSqualitySimulator = GNSS_NO_FIX;

	if (logsimufile)
	{
		fclose(logsimufile);
	}

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}